

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>::
Block(Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false> *this,
     Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true> *xpr,Index startRow,Index startCol,
     Index blockRows,Index blockCols)

{
  internal::
  BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false,_true>
  ::BlockImpl_dense((BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false,_true>
                     *)this,xpr,startRow,startCol,blockRows,blockCols);
  if (blockRows != 1) {
    __assert_fail("(RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows) && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                  ,0x91,
                  "Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1, 1, -1, -1>, 1, -1, true>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<float, -1, -1, 1, -1, -1>, 1, -1, true>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  if ((((-1 < startRow) && (startRow == 0)) && (-1 < (blockCols | startCol))) &&
     (startCol <=
      (xpr->super_BlockImpl<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>).
      super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>.m_cols.
      m_value - blockCols)) {
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                ,0x93,
                "Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1, 1, -1, -1>, 1, -1, true>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<float, -1, -1, 1, -1, -1>, 1, -1, true>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
               );
}

Assistant:

Block(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Impl(xpr, startRow, startCol, blockRows, blockCols)
    {
      eigen_assert((RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows)
          && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols));
      eigen_assert(startRow >= 0 && blockRows >= 0 && startRow  <= xpr.rows() - blockRows
          && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols);
    }